

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arbitrary.h
# Opt level: O0

vector<long_long,_std::allocator<long_long>_> * cppqc::shrinkIntegral<long_long>(longlong x)

{
  vector<long_long,_std::allocator<long_long>_> *pvVar1;
  vector<long_long,_std::allocator<long_long>_> *in_RSI;
  vector<long_long,_std::allocator<long_long>_> *in_RDI;
  longlong n;
  vector<long_long,_std::allocator<long_long>_> *ret;
  value_type_conflict2 *in_stack_ffffffffffffff98;
  vector<long_long,_std::allocator<long_long>_> *in_stack_ffffffffffffffa0;
  vector<long_long,_std::allocator<long_long>_> *local_40;
  
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)0x3f8825);
  local_40 = in_RSI;
  if ((long)in_RSI < 0) {
    in_stack_ffffffffffffffa0 = in_RSI;
    pvVar1 = (vector<long_long,_std::allocator<long_long>_> *)std::numeric_limits<long_long>::min();
    if (in_stack_ffffffffffffffa0 == pvVar1) {
      std::numeric_limits<long_long>::max();
      std::vector<long_long,_std::allocator<long_long>_>::push_back
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    else {
      if (-(long)in_RSI < 1) {
        __assert_fail("-x > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/philipp-classen[P]CppQuickCheck/include/cppqc/Arbitrary.h"
                      ,0x9c,
                      "std::vector<Integral> cppqc::shrinkIntegral(Integral) [Integral = long long]"
                     );
      }
      std::vector<long_long,_std::allocator<long_long>_>::push_back
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
  }
  for (; local_40 != (vector<long_long,_std::allocator<long_long>_> *)0x0;
      local_40 = (vector<long_long,_std::allocator<long_long>_> *)((long)local_40 / 2)) {
    std::vector<long_long,_std::allocator<long_long>_>::push_back
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  return in_RDI;
}

Assistant:

std::vector<Integral> shrinkIntegral(Integral x) {
  std::vector<Integral> ret;
  if (std::numeric_limits<Integral>::is_signed && x < 0) {
    if (x == std::numeric_limits<Integral>::min()) {
      ret.push_back(std::numeric_limits<Integral>::max());
    } else {
      assert(-x > 0);
      ret.push_back(-x);
    }
  }

  for (Integral n = x; n != 0; n /= 2)
    ret.push_back(x - n);
  return ret;
}